

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

void RigidBodyDynamics::ForwardDynamicsConstraintsDirect
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,ConstraintSet *CS,
               VectorNd *QDDot,bool update_kinematics,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  Scalar *pSVar1;
  ulong uVar2;
  size_t sVar3;
  long in_RDI;
  vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *in_R8;
  undefined1 in_stack_00000008;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_00000010;
  uint i_1;
  uint i;
  MatrixNd *in_stack_000002a8;
  VectorNd *in_stack_000002b0;
  VectorNd *in_stack_000002b8;
  VectorNd *in_stack_000002c0;
  MatrixNd *in_stack_000002c8;
  MatrixNd *in_stack_000002d0;
  VectorNd *in_stack_000002e0;
  VectorNd *in_stack_000002e8;
  LinearSolver *in_stack_000002f0;
  vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *index;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_ffffffffffffff30;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *this;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff50;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff58;
  Scalar SVar4;
  uint local_7c;
  uint local_78;
  bool in_stack_ffffffffffffff9f;
  ConstraintSet *in_stack_ffffffffffffffa0;
  VectorNd *in_stack_ffffffffffffffa8;
  VectorNd *in_stack_ffffffffffffffb0;
  VectorNd *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  
  CalcConstrainedSystemVariables
            ((Model *)(CONCAT17(in_stack_00000008,in_stack_ffffffffffffffc0) & 0x1ffffffffffffff),
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f,in_R8);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            (in_stack_ffffffffffffff30,in_stack_00000010);
  index = in_R8 + 0x13;
  this = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
         &in_R8[0x13].super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  SolveConstrainedSystemDirect
            (in_stack_000002d0,in_stack_000002c8,in_stack_000002c0,in_stack_000002b8,
             in_stack_000002b0,in_stack_000002a8,in_stack_000002e0,in_stack_000002e8,
             in_stack_000002f0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x6e1d5c);
  for (local_78 = 0; local_78 < *(uint *)(in_RDI + 0x48); local_78 = local_78 + 1) {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (this,(Index)index);
    SVar4 = *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (this,(Index)index);
    *pSVar1 = SVar4;
  }
  local_7c = 0;
  while( true ) {
    uVar2 = (ulong)local_7c;
    sVar3 = ConstraintSet::size((ConstraintSet *)0x6e1e01);
    if (sVar3 <= uVar2) break;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (this,(Index)index);
    SVar4 = *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (this,(Index)index);
    *pSVar1 = -SVar4;
    local_7c = local_7c + 1;
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsConstraintsDirect (
  Model &model,
  const VectorNd &Q,
  const VectorNd &QDot,
  const VectorNd &Tau,
  ConstraintSet &CS,
  VectorNd &QDDot,
  bool update_kinematics,
  std::vector<Math::SpatialVector> *f_ext
)
{
  LOG << "-------- " << __func__ << " --------" << std::endl;

  CalcConstrainedSystemVariables (model, Q, QDot, Tau, CS, update_kinematics, 
                                  f_ext);

  SolveConstrainedSystemDirect (CS.H, CS.G, Tau - CS.C, CS.gamma
                                , CS.force, CS.A, CS.b, CS.x, CS.linear_solver);

  // Copy back QDDot
  for (unsigned int i = 0; i < model.dof_count; i++) {
    QDDot[i] = CS.x[i];
  }

  // Copy back contact forces
  for (unsigned int i = 0; i < CS.size(); i++) {
    CS.force[i] = -CS.x[model.dof_count + i];
  }
}